

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BuildSystemCommand.cpp
# Opt level: O1

bool __thiscall
anon_unknown.dwarf_39292::ParseDummyNode::configureAttribute
          (ParseDummyNode *this,ConfigureContext *param_1,StringRef name,
          ArrayRef<llvm::StringRef> values)

{
  long lVar1;
  int iVar2;
  char *pcVar3;
  long lVar4;
  undefined1 *local_50;
  undefined8 local_48;
  undefined1 local_40;
  undefined7 uStack_3f;
  
  pcVar3 = name.Data;
  iVar2 = (*(this->delegate->super_BuildFileDelegate)._vptr_BuildFileDelegate[0xd])();
  if ((char)iVar2 != '\0') {
    local_50 = &local_40;
    if (pcVar3 == (char *)0x0) {
      local_48 = 0;
      local_40 = 0;
    }
    else {
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_50,pcVar3,pcVar3 + name.Length);
    }
    printf("  -- \'%s\': [",local_50);
    if (local_50 != &local_40) {
      operator_delete(local_50,CONCAT71(uStack_3f,local_40) + 1);
    }
    if (values.Length != 0) {
      lVar4 = 0;
      pcVar3 = "";
      do {
        lVar1 = *(long *)((long)&(values.Data)->Data + lVar4);
        if (lVar1 == 0) {
          local_48 = 0;
          local_40 = 0;
          local_50 = &local_40;
        }
        else {
          local_50 = &local_40;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)&local_50,lVar1,
                     *(long *)((long)&(values.Data)->Length + lVar4) + lVar1);
        }
        printf("%s\'%s\'",pcVar3,local_50);
        if (local_50 != &local_40) {
          operator_delete(local_50,CONCAT71(uStack_3f,local_40) + 1);
        }
        lVar4 = lVar4 + 0x10;
        pcVar3 = ", ";
      } while (values.Length << 4 != lVar4);
    }
    puts("]");
  }
  return true;
}

Assistant:

virtual bool configureAttribute(const ConfigureContext&, StringRef name,
                                  ArrayRef<StringRef> values) override {
    if (delegate.shouldShowOutput()) {
      printf("  -- '%s': [", name.str().c_str());
      bool first = true;
      for (const auto& value: values) {
        printf("%s'%s'", first ? "" : ", ", value.str().c_str());
        first = false;
      }
      printf("]\n");
    }
    return true;
  }